

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uloc.cpp
# Opt level: O2

int32_t uloc_getCountry_63(char *localeID,char *country,int32_t countryCapacity,UErrorCode *err)

{
  int32_t iVar1;
  char *scriptID;
  char *local_38;
  char *local_30;
  
  iVar1 = 0;
  if ((err != (UErrorCode *)0x0) && (iVar1 = 0, *err < U_ILLEGAL_ARGUMENT_ERROR)) {
    local_38 = localeID;
    if (localeID == (char *)0x0) {
      local_38 = locale_get_default_63();
    }
    iVar1 = 0;
    ulocimp_getLanguage_63(local_38,(char *)0x0,0,&local_38);
    if ((*local_38 == '_') || (*local_38 == '-')) {
      iVar1 = 0;
      ulocimp_getScript_63(local_38 + 1,(char *)0x0,0,&local_30);
      if (local_30 != local_38 + 1) {
        local_38 = local_30;
      }
      if ((*local_38 == '_') || (*local_38 == '-')) {
        iVar1 = ulocimp_getCountry_63(local_38 + 1,country,countryCapacity,(char **)0x0);
      }
    }
    iVar1 = u_terminateChars_63(country,countryCapacity,iVar1,err);
  }
  return iVar1;
}

Assistant:

U_CAPI int32_t  U_EXPORT2
uloc_getCountry(const char* localeID,
            char* country,
            int32_t countryCapacity,
            UErrorCode* err)
{
    int32_t i=0;

    if(err==NULL || U_FAILURE(*err)) {
        return 0;
    }

    if(localeID==NULL) {
        localeID=uloc_getDefault();
    }

    /* Skip the language */
    ulocimp_getLanguage(localeID, NULL, 0, &localeID);
    if(_isIDSeparator(*localeID)) {
        const char *scriptID;
        /* Skip the script if available */
        ulocimp_getScript(localeID+1, NULL, 0, &scriptID);
        if(scriptID != localeID+1) {
            /* Found optional script */
            localeID = scriptID;
        }
        if(_isIDSeparator(*localeID)) {
            i=ulocimp_getCountry(localeID+1, country, countryCapacity, NULL);
        }
    }
    return u_terminateChars(country, countryCapacity, i, err);
}